

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

string_view __thiscall slang::ast::DefinitionSymbol::getArticleKindString(DefinitionSymbol *this)

{
  string_view sVar1;
  string_view sVar2;
  string_view sVar3;
  
  if (this->definitionKind == Module) {
    sVar2._M_str = "a module";
    sVar2._M_len = 8;
    return sVar2;
  }
  if (this->definitionKind == Program) {
    sVar1._M_str = "a program";
    sVar1._M_len = 9;
    return sVar1;
  }
  sVar3._M_str = "an interface";
  sVar3._M_len = 0xc;
  return sVar3;
}

Assistant:

std::string_view DefinitionSymbol::getArticleKindString() const {
    switch (definitionKind) {
        case DefinitionKind::Module:
            return "a module"sv;
        case DefinitionKind::Interface:
            return "an interface"sv;
        case DefinitionKind::Program:
            return "a program"sv;
    }
    SLANG_UNREACHABLE;
}